

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_rotatev3(matrix4 *self,vector3 *axis,float angle)

{
  quaternion *qT;
  matrix4 *pmVar1;
  undefined1 local_6c [8];
  quaternion q;
  matrix4 rotationMatrix;
  float angle_local;
  vector3 *axis_local;
  matrix4 *self_local;
  
  qT = quaternion_set_from_axis_anglev3((quaternion *)local_6c,axis,angle);
  pmVar1 = matrix4_make_transformation_rotationq((matrix4 *)((long)&q.field_0 + 8),qT);
  pmVar1 = matrix4_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix4 *matrix4_rotatev3(struct matrix4 *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct matrix4 rotationMatrix;
	struct quaternion q;

	return matrix4_multiply(self,
				matrix4_make_transformation_rotationq(&rotationMatrix,
								      quaternion_set_from_axis_anglev3(&q, axis, angle)));
}